

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O0

Level * __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>::getLevel
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *this,Geometry *geom)

{
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  __first;
  const_iterator cVar1;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> _Var2
  ;
  Level *pLVar3;
  Geometry *in_RSI;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_RDI;
  int i;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> it;
  Box *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::begin<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  cVar1 = std::end<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
                    ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  Geometry::Domain(in_RSI);
  _Var2._M_current._4_4_ = in_stack_ffffffffffffffd4;
  _Var2._M_current._0_4_ = in_stack_ffffffffffffffd0;
  _Var2 = std::
          find<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,amrex::Box>
                    (cVar1._M_current,_Var2,in_stack_ffffffffffffffc8);
  cVar1 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin(in_RDI);
  __first._M_current._4_4_ = in_stack_ffffffffffffffd4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffd0;
  std::
  distance<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
            (__first,(__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                      )cVar1._M_current);
  pLVar3 = &Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
            ::operator[]((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                          *)_Var2._M_current,(size_type)in_RDI)->super_Level;
  return pLVar3;
}

Assistant:

const Level&
IndexSpaceImp<G>::getLevel (const Geometry& geom) const
{
    auto it = std::find(std::begin(m_domain), std::end(m_domain), geom.Domain());
    int i = std::distance(m_domain.begin(), it);
    return m_gslevel[i];
}